

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

bool ViconDataStreamSDK::Core::anon_unknown_11::GetSamples<ViconCGStream::VForceFrame>
               (vector<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>
                *i_rFrames,VChannelInfo *i_rChannel,uint i_Subsample,UInt64 i_DevicePeriod,
               UInt64 i_DeviceStartTick,TPeriod *i_rFramePeriod,
               vector<double,_std::allocator<double>_> *o_rSamples,bool *o_rbOccluded)

{
  bool bVar1;
  uint uVar2;
  VForceFrame *pVVar3;
  size_type sVar4;
  const_reference pvVar5;
  double local_88;
  VForceFrame *local_80;
  size_t i;
  ulong uStack_70;
  uint SubSample;
  UInt64 SamplePeriod;
  size_t Stride;
  VForceFrame *rFrame;
  size_t NumComponents;
  const_iterator End;
  const_iterator It;
  TPeriod *i_rFramePeriod_local;
  UInt64 i_DeviceStartTick_local;
  UInt64 i_DevicePeriod_local;
  uint i_Subsample_local;
  VChannelInfo *i_rChannel_local;
  vector<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_> *i_rFrames_local;
  
  std::vector<double,_std::allocator<double>_>::clear(o_rSamples);
  *o_rbOccluded = true;
  End = std::vector<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>::begin
                  (i_rFrames);
  NumComponents =
       (size_t)std::vector<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>
               ::end(i_rFrames);
  rFrame = (VForceFrame *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(&i_rChannel->m_ComponentNames);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&End,(__normal_iterator<const_ViconCGStream::VForceFrame_*,_std::vector<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>_>
                             *)&NumComponents);
    if (!bVar1) {
      return true;
    }
    Stride = (size_t)__gnu_cxx::
                     __normal_iterator<const_ViconCGStream::VForceFrame_*,_std::vector<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>_>
                     ::operator*(&End);
    if ((((((reference)Stride)->m_DeviceID == i_rChannel->m_DeviceID) &&
         (((reference)Stride)->m_ChannelID == i_rChannel->m_ChannelID)) &&
        (pVVar3 = (VForceFrame *)
                  std::vector<float,_std::allocator<float>_>::size(&((reference)Stride)->m_Samples),
        rFrame <= pVVar3)) && (rFrame != (VForceFrame *)0x0)) {
      sVar4 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)(Stride + 0x18));
      SamplePeriod = sVar4 / (ulong)rFrame;
      if (i_DevicePeriod % SamplePeriod != 0) {
        __assert_fail("i_DevicePeriod % Stride == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCore/CoreClient.cpp"
                      ,0xea3,
                      "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSamples(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const unsigned int, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, std::vector<double> &, bool &) [TFrame = ViconCGStream::VForceFrame]"
                     );
      }
      uStack_70 = i_DevicePeriod / SamplePeriod;
      uVar2 = anon_unknown.dwarf_9508b::GetSamplesInFrame
                        (i_rFramePeriod,i_DeviceStartTick,uStack_70);
      if (uVar2 <= i_Subsample) {
        return false;
      }
      i._4_4_ = 0;
      bVar1 = anon_unknown.dwarf_9508b::SampleIndexInRange
                        (i_Subsample,*(uint *)(Stride + 8),SamplePeriod,uStack_70,i_DeviceStartTick,
                         i_rFramePeriod,(uint *)((long)&i + 4));
      if (bVar1) {
        for (local_80 = (VForceFrame *)0x0; local_80 < rFrame;
            local_80 = (VForceFrame *)((long)&(local_80->super_VItem)._vptr_VItem + 1)) {
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)(Stride + 0x18),
                              (long)local_80 * SamplePeriod + (ulong)i._4_4_);
          local_88 = (double)*pvVar5;
          std::vector<double,_std::allocator<double>_>::push_back(o_rSamples,&local_88);
        }
        *o_rbOccluded = false;
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_ViconCGStream::VForceFrame_*,_std::vector<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>_>
    ::operator++(&End);
  } while( true );
}

Assistant:

bool GetSamples( const std::vector< TFrame > & i_rFrames,
                   const ViconCGStream::VChannelInfo & i_rChannel,
                   const unsigned int            i_Subsample,
                   const ViconCGStreamType::UInt64 i_DevicePeriod,
                   const ViconCGStreamType::UInt64 i_DeviceStartTick,
                   const TPeriod               & i_rFramePeriod,
                   std::vector< double >       & o_rSamples,
                         bool                  & o_rbOccluded )
  {
    o_rSamples.clear();
    o_rbOccluded = true;

    typename std::vector< TFrame >::const_iterator It  = i_rFrames.begin();
    typename std::vector< TFrame >::const_iterator End = i_rFrames.end();

    const size_t NumComponents = i_rChannel.m_ComponentNames.size();
    for( ; It != End ; ++It )
    {
      const TFrame & rFrame( *It );
      if( rFrame.m_DeviceID       == i_rChannel.m_DeviceID  &&
          rFrame.m_ChannelID      == i_rChannel.m_ChannelID &&
          rFrame.m_Samples.size() >= NumComponents && 
          NumComponents != 0 )
      {
        const size_t Stride = rFrame.m_Samples.size() / NumComponents;

        assert( i_DevicePeriod % Stride == 0 );

        const ViconCGStreamType::UInt64 SamplePeriod = i_DevicePeriod / Stride;

        if ( i_Subsample >= GetSamplesInFrame( i_rFramePeriod, i_DeviceStartTick, SamplePeriod ) )
        {
          // Out of range for the entire frame.
          return false;
        }

        unsigned int SubSample = 0;
        if( !SampleIndexInRange( i_Subsample, rFrame.m_FrameID, Stride, SamplePeriod, i_DeviceStartTick, i_rFramePeriod, SubSample ) )
        {
          // Not in the current set of samples - might be in a later one though.
          continue;
        }

        for( size_t i = 0 ; i < NumComponents ; ++i )
        {
          o_rSamples.push_back( rFrame.m_Samples[ i * Stride + SubSample ] );
        }

        o_rbOccluded = false;
        break;
      }
    }

    return true;
  }